

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall StringPieceUtilTestToLowerASCII::Run(StringPieceUtilTestToLowerASCII *this)

{
  Test *pTVar1;
  char cVar2;
  StringPieceUtilTestToLowerASCII *this_local;
  
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('A');
  testing::Test::Check
            (pTVar1,cVar2 == 'a',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x71,"\'a\' == ToLowerASCII(\'A\')");
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('Z');
  testing::Test::Check
            (pTVar1,cVar2 == 'z',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x72,"\'z\' == ToLowerASCII(\'Z\')");
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('a');
  testing::Test::Check
            (pTVar1,cVar2 == 'a',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x73,"\'a\' == ToLowerASCII(\'a\')");
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('z');
  testing::Test::Check
            (pTVar1,cVar2 == 'z',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x74,"\'z\' == ToLowerASCII(\'z\')");
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('/');
  testing::Test::Check
            (pTVar1,cVar2 == '/',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x75,"\'/\' == ToLowerASCII(\'/\')");
  pTVar1 = g_current_test;
  cVar2 = ToLowerASCII('1');
  testing::Test::Check
            (pTVar1,cVar2 == '1',
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x76,"\'1\' == ToLowerASCII(\'1\')");
  return;
}

Assistant:

TEST(StringPieceUtilTest, ToLowerASCII) {
  EXPECT_EQ('a', ToLowerASCII('A'));
  EXPECT_EQ('z', ToLowerASCII('Z'));
  EXPECT_EQ('a', ToLowerASCII('a'));
  EXPECT_EQ('z', ToLowerASCII('z'));
  EXPECT_EQ('/', ToLowerASCII('/'));
  EXPECT_EQ('1', ToLowerASCII('1'));
}